

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

xmlSaveCtxtPtr xmlNewSaveCtxt(char *encoding,int options)

{
  int code;
  xmlChar *pxVar1;
  int res;
  xmlSaveCtxtPtr ret;
  int options_local;
  char *encoding_local;
  
  encoding_local = (char *)(*xmlMalloc)(0x90);
  if ((xmlSaveCtxtPtr)encoding_local == (xmlSaveCtxtPtr)0x0) {
    xmlSaveErrMemory((xmlOutputBufferPtr)0x0);
    encoding_local = (char *)0x0;
  }
  else {
    memset(encoding_local,0,0x90);
    if (encoding != (char *)0x0) {
      code = xmlOpenCharEncodingHandler(encoding,1,&((xmlSaveCtxtPtr)encoding_local)->handler);
      if (code != 0) {
        xmlSaveErr((xmlOutputBufferPtr)0x0,code,(xmlNodePtr)0x0,encoding);
        xmlFreeSaveCtxt((xmlSaveCtxtPtr)encoding_local);
        return (xmlSaveCtxtPtr)0x0;
      }
      pxVar1 = xmlStrdup((xmlChar *)encoding);
      ((xmlSaveCtxtPtr)encoding_local)->encoding = pxVar1;
    }
    xmlSaveCtxtInit((xmlSaveCtxtPtr)encoding_local,options);
  }
  return (xmlSaveCtxtPtr)encoding_local;
}

Assistant:

static xmlSaveCtxtPtr
xmlNewSaveCtxt(const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = (xmlSaveCtxtPtr) xmlMalloc(sizeof(xmlSaveCtxt));
    if (ret == NULL) {
	xmlSaveErrMemory(NULL);
	return ( NULL );
    }
    memset(ret, 0, sizeof(xmlSaveCtxt));

    if (encoding != NULL) {
        int res;

        res = xmlOpenCharEncodingHandler(encoding, /* output */ 1,
                                         &ret->handler);
	if (res != XML_ERR_OK) {
	    xmlSaveErr(NULL, res, NULL, encoding);
            xmlFreeSaveCtxt(ret);
	    return(NULL);
	}
        ret->encoding = xmlStrdup((const xmlChar *)encoding);
    }

    xmlSaveCtxtInit(ret, options);

    return(ret);
}